

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

ImageFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_imagetype(FeatureType *this)

{
  ImageFeatureType *this_00;
  
  if (this->_oneof_case_[0] == 4) {
    this_00 = (ImageFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 4;
    this_00 = (ImageFeatureType *)operator_new(0x38);
    ImageFeatureType::ImageFeatureType(this_00);
    (this->Type_).imagetype_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType* FeatureType::mutable_imagetype() {
  if (!has_imagetype()) {
    clear_Type();
    set_has_imagetype();
    Type_.imagetype_ = new ::CoreML::Specification::ImageFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.imageType)
  return Type_.imagetype_;
}